

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_rewriter.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionRewriter::VisitOperator(ExpressionRewriter *this,LogicalOperator *op)

{
  pointer prVar1;
  pointer puVar2;
  type in_RAX;
  LogicalFilter *pLVar3;
  unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *rule;
  pointer this_00;
  reference_wrapper<duckdb::Rule> local_38;
  
  local_38._M_data = in_RAX;
  LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
  (this->op).ptr = op;
  prVar1 = (this->to_apply_rules).
           super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->to_apply_rules).
      super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != prVar1) {
    (this->to_apply_rules).
    super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = prVar1;
  }
  puVar2 = (this->rules).
           super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->rules).
                 super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2; this_00 = this_00 + 1
      ) {
    local_38._M_data =
         unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>::operator*(this_00);
    ::std::
    vector<std::reference_wrapper<duckdb::Rule>,std::allocator<std::reference_wrapper<duckdb::Rule>>>
    ::emplace_back<std::reference_wrapper<duckdb::Rule>>
              ((vector<std::reference_wrapper<duckdb::Rule>,std::allocator<std::reference_wrapper<duckdb::Rule>>>
                *)&this->to_apply_rules,&local_38);
  }
  LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
  if (op->type == LOGICAL_FILTER) {
    pLVar3 = LogicalOperator::Cast<duckdb::LogicalFilter>(op);
    LogicalFilter::SplitPredicates(&(pLVar3->super_LogicalOperator).expressions);
  }
  return;
}

Assistant:

void ExpressionRewriter::VisitOperator(LogicalOperator &op) {
	VisitOperatorChildren(op);
	this->op = &op;

	to_apply_rules.clear();
	for (auto &rule : rules) {
		to_apply_rules.push_back(*rule);
	}

	VisitOperatorExpressions(op);

	// if it is a LogicalFilter, we split up filter conjunctions again
	if (op.type == LogicalOperatorType::LOGICAL_FILTER) {
		auto &filter = op.Cast<LogicalFilter>();
		filter.SplitPredicates();
	}
}